

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionInfo.cpp
# Opt level: O2

string * __thiscall
PositionInfo::GetStringPosition_abi_cxx11_(string *__return_storage_ptr__,PositionInfo *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"(",(allocator *)&local_50);
  std::__cxx11::to_string(&local_30,this->firstLine);
  std::operator+(&local_50,&local_30,",");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::to_string(&local_30,this->firstColumn);
  std::operator+(&local_50,&local_30,") : (");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::to_string(&local_30,this->lastLine);
  std::operator+(&local_50,&local_30,",");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::to_string(&local_50,this->lastColumn);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string PositionInfo::GetStringPosition() const {
	std::string result = "\"(";
	result += std::to_string(firstLine) + ",";
	result += std::to_string(firstColumn) + ") : (";
	result += std::to_string(lastLine) + ",";
	result += std::to_string(lastColumn);
	result += ")\"";
	return result;
}